

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

Value * __thiscall
soul::heart::Parser::parseConstant
          (Value *__return_storage_ptr__,Parser *this,Type *requiredType,bool throwOnError)

{
  double dVar1;
  int64_t iVar2;
  pointer pcVar3;
  ProgramImpl *pPVar4;
  bool bVar5;
  Category CVar6;
  Handle h;
  Structure *this_00;
  long lVar7;
  ulong uVar8;
  char *expected;
  Value *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ArrayView<soul::Value> elements;
  ArrayView<soul::Value> elements_00;
  ArrayView<soul::Value> members;
  ArrayWithPreallocation<soul::Value,_8UL> memberValues;
  undefined1 local_2d8 [32];
  uchar *local_2b8;
  size_t local_2b0;
  size_t local_2a8;
  uchar local_2a0 [8];
  undefined1 local_298 [32];
  uchar *local_278;
  Structure *local_270;
  undefined1 local_268 [16];
  StructurePtr local_258;
  pool_ptr<const_soul::Module> local_250;
  undefined1 local_248 [8];
  pointer local_240;
  undefined1 local_238 [16];
  StructurePtr local_228;
  
  bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x27e598);
  if (bVar5) {
    bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x27cf28);
    if (bVar5) {
      local_268[0] = requiredType->category;
      local_268[1] = requiredType->arrayElementCategory;
      local_268[2] = requiredType->isRef;
      local_268[3] = requiredType->isConstant;
      local_268._4_4_ = requiredType->primitiveType;
      local_268._8_4_ = requiredType->boundingSize;
      local_268._12_4_ = requiredType->arrayElementBoundingSize;
      local_258.object = (requiredType->structure).object;
      if (local_258.object != (Structure *)0x0) {
        ((local_258.object)->super_RefCountedObject).refCount =
             ((local_258.object)->super_RefCountedObject).refCount + 1;
      }
      soul::Value::zeroInitialiser(__return_storage_ptr__,(Type *)local_268);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_258.object);
      return __return_storage_ptr__;
    }
    CVar6 = requiredType->category;
    if (CVar6 == structure) {
      this_00 = Type::getStructRef(requiredType);
      local_248 = (undefined1  [8])(local_238 + 8);
      local_240 = (pointer)0x0;
      local_238._0_8_ = (Structure *)0x8;
      ArrayWithPreallocation<soul::Value,_8UL>::reserve
                ((ArrayWithPreallocation<soul::Value,_8UL> *)local_248,(this_00->members).numActive)
      ;
      if ((this_00->members).numActive != 0) {
        lVar7 = 0;
        uVar8 = 0;
        do {
          parseConstant((Value *)local_2d8,this,
                        (Type *)(&(((this_00->members).items)->type).category + lVar7),true);
          ArrayWithPreallocation<soul::Value,_8UL>::push_back
                    ((ArrayWithPreallocation<soul::Value,_8UL> *)local_248,(Value *)local_2d8);
          soul::Value::~Value((Value *)local_2d8);
          expected = ",";
          if (uVar8 == (this_00->members).numActive - 1) {
            expected = "}";
          }
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::expect<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)expected);
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x40;
        } while (uVar8 < (this_00->members).numActive);
      }
      members.s = (Value *)((long)local_248 + (long)local_240 * 0x40);
      members.e = in_R8;
      soul::Value::createStruct
                (__return_storage_ptr__,(Value *)this_00,(Structure *)local_248,members);
      ArrayWithPreallocation<soul::Value,_8UL>::clear
                ((ArrayWithPreallocation<soul::Value,_8UL> *)local_248);
      return __return_storage_ptr__;
    }
    if (CVar6 == array) {
      local_298[0x18] = requiredType->category;
      local_298[0x19] = requiredType->arrayElementCategory;
      local_298[0x1a] = requiredType->isRef;
      local_298[0x1b] = requiredType->isConstant;
      local_298._28_4_ = requiredType->primitiveType;
      local_278 = *(uchar **)&requiredType->boundingSize;
      local_270 = (requiredType->structure).object;
      if (local_270 != (Structure *)0x0) {
        (local_270->super_RefCountedObject).refCount =
             (local_270->super_RefCountedObject).refCount + 1;
      }
      Type::getArrayElementType((Type *)local_2d8,requiredType);
      if (requiredType->category == array) {
        parseConstantList((vector<soul::Value,_std::allocator<soul::Value>_> *)local_248,this,
                          (Type *)local_2d8,(long)requiredType->boundingSize);
        elements_00.e = in_R8;
        elements_00.s = local_240;
        soul::Value::createArrayOrVector
                  (__return_storage_ptr__,(Value *)(local_298 + 0x18),(Type *)local_248,elements_00)
        ;
        std::vector<soul::Value,_std::allocator<soul::Value>_>::~vector
                  ((vector<soul::Value,_std::allocator<soul::Value>_> *)local_248);
        RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_2d8._16_8_);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_270);
        return __return_storage_ptr__;
      }
      throwInternalCompilerError("isArray()","getArraySize",0x128);
    }
    if (CVar6 == vector) {
      local_298[0] = requiredType->category;
      local_298[1] = requiredType->arrayElementCategory;
      local_298[2] = requiredType->isRef;
      local_298[3] = requiredType->isConstant;
      local_298._4_4_ = (requiredType->primitiveType).type;
      local_298._8_4_ = requiredType->boundingSize;
      local_298._12_4_ = requiredType->arrayElementBoundingSize;
      local_298._16_8_ = (requiredType->structure).object;
      if ((Structure *)local_298._16_8_ != (Structure *)0x0) {
        (((Structure *)local_298._16_8_)->super_RefCountedObject).refCount =
             (((Structure *)local_298._16_8_)->super_RefCountedObject).refCount + 1;
      }
      if (local_298[0] == vector) {
        local_2d8._1_3_ = 0;
        local_2d8[0] = local_298._4_4_ != invalid;
        local_2d8._4_4_ = local_298._4_4_;
        local_2d8._8_8_ = 0;
        local_2d8._16_8_ = (Structure *)0x0;
        parseConstantList((vector<soul::Value,_std::allocator<soul::Value>_> *)local_248,this,
                          (Type *)local_2d8,(long)requiredType->boundingSize);
        elements.e = in_R8;
        elements.s = local_240;
        soul::Value::createArrayOrVector
                  (__return_storage_ptr__,(Value *)local_298,(Type *)local_248,elements);
        std::vector<soul::Value,_std::allocator<soul::Value>_>::~vector
                  ((vector<soul::Value,_std::allocator<soul::Value>_> *)local_248);
        RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_2d8._16_8_);
        RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_298._16_8_);
        return __return_storage_ptr__;
      }
      throwInternalCompilerError("isVector()","getVectorElementType",0xfd);
    }
  }
  bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x29f328);
  if (bVar5) {
    parseConstant((Value *)local_248,this,requiredType,throwOnError);
    negate(__return_storage_ptr__,this,(Value *)local_248);
    goto LAB_00246f95;
  }
  CVar6 = requiredType->category;
  if ((CVar6 & ~primitive) == wrap) {
    uVar8 = (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).literalIntValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x27e4d6);
    if ((requiredType->category & ~primitive) != wrap) {
      throwInternalCompilerError("isBoundedInt()","isValidBoundedIntIndex",0xb1);
    }
    if (((long)uVar8 < 0) || ((ulong)(long)requiredType->boundingSize <= uVar8)) {
      CompileMessageHelpers::createMessage<>
                ((CompileMessage *)local_248,syntax,error,"Index is out of range");
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,(CompileMessage *)local_248);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_228.object);
      if (local_248 != (undefined1  [8])local_238) {
        operator_delete((void *)local_248,(ulong)(local_238._0_8_ + 1));
      }
    }
    soul::Value::Value((Value *)local_248,uVar8);
    soul::Value::castToTypeWithError<soul::CodeLocation&>
              (__return_storage_ptr__,(Value *)local_248,requiredType,
               &(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location);
    goto LAB_00246f95;
  }
  if (CVar6 != primitive) {
LAB_0024734d:
    if ((CVar6 & ~primitive) == vector) {
      Type::getElementType((Type *)local_2d8,requiredType);
      parseConstant((Value *)local_248,this,(Type *)local_2d8,false);
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_2d8._16_8_);
      local_2b8 = local_2a0;
      local_2d8._16_8_ = (Structure *)0x0;
      local_2d8._24_8_ = 0;
      local_2d8._0_8_ = (pointer)0x0;
      local_2d8._8_8_ = 0;
      local_2b0 = 0;
      local_2a8 = 8;
      bVar5 = soul::Value::operator==((Value *)local_248,(Value *)local_2d8);
      soul::Value::~Value((Value *)local_2d8);
      if (!bVar5) {
        soul::Value::castToTypeWithError<soul::CodeLocation&>
                  (__return_storage_ptr__,(Value *)local_248,requiredType,
                   &(this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ).location);
        goto LAB_00246f95;
      }
      soul::Value::~Value((Value *)local_248);
      CVar6 = requiredType->category;
    }
    if (CVar6 == stringLiteral) {
      pcVar3 = (this->
               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ).currentStringValue._M_dataplus._M_p;
      local_248 = (undefined1  [8])local_238;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_248,pcVar3,
                 pcVar3 + (this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          ).currentStringValue._M_string_length);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x27e53f);
      pPVar4 = (this->program).pimpl;
      h.handle = (*(pPVar4->stringDictionary).super_StringDictionary._vptr_StringDictionary[2])
                           (&pPVar4->stringDictionary,local_240,local_248);
      soul::Value::createStringLiteral(__return_storage_ptr__,h);
      if (local_248 == (undefined1  [8])local_238) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_248,(ulong)(local_238._0_8_ + 1));
      return __return_storage_ptr__;
    }
switchD_00246fdd_caseD_4:
    if (throwOnError) {
      local_250.object = (this->module).object;
      Program::ProgramImpl::getTypeDescriptionWithQualificationIfNeeded_abi_cxx11_
                ((string *)local_2d8,(this->program).pimpl,&local_250,requiredType);
      CompileMessageHelpers::createMessage<std::__cxx11::string>
                ((CompileMessage *)local_248,(CompileMessageHelpers *)0x1,none,0x2a2f0d,
                 (char *)local_2d8,in_R9);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,local_248);
      CompileMessage::~CompileMessage((CompileMessage *)local_248);
      if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
        operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
      }
    }
    (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
    (__return_storage_ptr__->allocatedData).allocatedSize = 0;
    (__return_storage_ptr__->type).category = invalid;
    (__return_storage_ptr__->type).arrayElementCategory = invalid;
    (__return_storage_ptr__->type).isRef = false;
    (__return_storage_ptr__->type).isConstant = false;
    (__return_storage_ptr__->type).primitiveType = invalid;
    (__return_storage_ptr__->type).boundingSize = 0;
    (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.items =
         (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
    (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
    return __return_storage_ptr__;
  }
  switch((requiredType->primitiveType).type) {
  case float32:
    bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x27e4d6);
    if ((bVar5) ||
       (bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x27e4e1), bVar5)) {
      soul::Value::Value(__return_storage_ptr__,
                         (float)(this->
                                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                ).literalIntValue);
      return __return_storage_ptr__;
    }
    parseNaNandInfinityTokens((Value *)local_248,this);
    if ((local_248[0] != (string)0x0) && (local_248._4_4_ == float32)) {
LAB_00247335:
      soul::Value::Value(__return_storage_ptr__,(Value *)local_248);
      goto LAB_00246f95;
    }
    dVar1 = (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).literalDoubleValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x27e584);
    soul::Value::Value((Value *)local_2d8,dVar1);
    soul::Value::castToTypeWithError<soul::CodeLocation&>
              (__return_storage_ptr__,(Value *)local_2d8,requiredType,
               &(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location);
    break;
  case float64:
    bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x27e4d6);
    if ((bVar5) ||
       (bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x27e4e1), bVar5)) {
      soul::Value::Value(__return_storage_ptr__,
                         (double)(this->
                                 super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                 ).literalIntValue);
      return __return_storage_ptr__;
    }
    parseNaNandInfinityTokens((Value *)local_248,this);
    if ((local_248[0] != (string)0x0) && (local_248._4_4_ == float64)) goto LAB_00247335;
    dVar1 = (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).literalDoubleValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x27e57b);
    soul::Value::Value((Value *)local_2d8,dVar1);
    soul::Value::castToTypeWithError<soul::CodeLocation&>
              (__return_storage_ptr__,(Value *)local_2d8,requiredType,
               &(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location);
    break;
  default:
    goto switchD_00246fdd_caseD_4;
  case int32:
    iVar2 = (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).literalIntValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x27e4d6);
    soul::Value::Value((Value *)local_248,iVar2);
    soul::Value::castToTypeWithError<soul::CodeLocation&>
              (__return_storage_ptr__,(Value *)local_248,requiredType,
               &(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location);
    goto LAB_00246f95;
  case int64:
    iVar2 = (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).literalIntValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x27e4e1);
    soul::Value::Value((Value *)local_248,iVar2);
    soul::Value::castToTypeWithError<soul::CodeLocation&>
              (__return_storage_ptr__,(Value *)local_248,requiredType,
               &(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location);
    goto LAB_00246f95;
  case bool_:
    bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,"true");
    if (bVar5) {
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
      bVar5 = true;
LAB_00247294:
      soul::Value::Value(__return_storage_ptr__,bVar5);
      return __return_storage_ptr__;
    }
    bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,"false");
    if (bVar5) {
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
      bVar5 = false;
      goto LAB_00247294;
    }
    CVar6 = requiredType->category;
    goto LAB_0024734d;
  }
  soul::Value::~Value((Value *)local_2d8);
LAB_00246f95:
  soul::Value::~Value((Value *)local_248);
  return __return_storage_ptr__;
}

Assistant:

Value parseConstant (const Type& requiredType, bool throwOnError)
    {
        if (matchIf (HEARTOperator::openBrace))
        {
            if (matchIf (HEARTOperator::closeBrace))
                return Value::zeroInitialiser (requiredType);

            if (requiredType.isVector())
                return Value::createArrayOrVector (requiredType,
                                                   parseConstantList (requiredType.getVectorElementType(),
                                                                      requiredType.getVectorSize()));

            if (requiredType.isArray())
                return Value::createArrayOrVector (requiredType,
                                                   parseConstantList (requiredType.getArrayElementType(),
                                                                      requiredType.getArraySize()));

            if (requiredType.isStruct())
            {
                auto& s = requiredType.getStructRef();
                ArrayWithPreallocation<Value, 8> memberValues;
                memberValues.reserve (s.getNumMembers());

                for (size_t i = 0; i < s.getNumMembers(); ++i)
                {
                    memberValues.push_back (parseConstant (s.getMemberType (i), true));

                    if (i == s.getNumMembers() - 1)
                        expect (HEARTOperator::closeBrace);
                    else
                        expect (HEARTOperator::comma);
                }

                return Value::createStruct (s, memberValues);
            }
        }

        if (matchIf (HEARTOperator::minus))
            return negate (parseConstant (requiredType, throwOnError));

        if (requiredType.isBoundedInt())
        {
            auto val = parseLiteralInt();

            if (! requiredType.isValidBoundedIntIndex (val))
                throwError (Errors::indexOutOfRange());

            return castValue (Value (val), requiredType);
        }

        if (requiredType.isPrimitive())
        {
            if (requiredType.isFloat64())
            {
                if (matchIf (Token::literalInt32) || matchIf (Token::literalInt64))
                    return Value ((double) literalIntValue);

                auto infOrNaN = parseNaNandInfinityTokens();

                if (infOrNaN.isValid() && infOrNaN.getType().isFloat64())
                    return infOrNaN;

                auto val = literalDoubleValue;
                expect (Token::literalFloat64);
                return castValue (Value (val), requiredType);
            }

            if (requiredType.isFloat32())
            {
                if (matchIf (Token::literalInt32) || matchIf (Token::literalInt64))
                    return Value ((float) literalIntValue);

                auto infOrNaN = parseNaNandInfinityTokens();

                if (infOrNaN.isValid() && infOrNaN.getType().isFloat32())
                    return infOrNaN;

                auto val = literalDoubleValue;
                expect (Token::literalFloat32);
                return castValue (Value (val), requiredType);
            }

            if (requiredType.isInteger32())
            {
                auto val = literalIntValue;
                expect (Token::literalInt32);
                return castValue (Value (val), requiredType);
            }

            if (requiredType.isInteger64())
            {
                auto val = literalIntValue;
                expect (Token::literalInt64);
                return castValue (Value (val), requiredType);
            }

            if (requiredType.isBool())
            {
                if (matchIf ("true"))  return Value (true);
                if (matchIf ("false")) return Value (false);
            }
        }

        if (requiredType.isArrayOrVector())
        {
            auto singleValue = parseConstant (requiredType.getElementType(), false);

            if (singleValue != Value())
                return castValue (singleValue, requiredType);
        }

        if (requiredType.isStringLiteral())
        {
            auto n = currentStringValue;
            expect (Token::literalString);
            return Value::createStringLiteral (program.getStringDictionary().getHandleForString (n));
        }

        if (throwOnError)
            throwError (Errors::expectedExpressionOfType (getTypeDescription (requiredType)));

        return {};
    }